

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

string * FixText(string *__return_storage_ptr__,TSpellCorrector *corrector,string *text)

{
  undefined1 local_60 [8];
  wstring input;
  
  NJamSpell::UTF8ToWide((wstring *)local_60,text);
  NJamSpell::TSpellCorrector::FixFragment
            ((wstring *)((long)&input.field_2 + 8),corrector,(wstring *)local_60);
  NJamSpell::WideToUTF8(__return_storage_ptr__,(wstring *)((long)&input.field_2 + 8));
  std::__cxx11::wstring::~wstring((wstring *)((long)&input.field_2 + 8));
  std::__cxx11::wstring::~wstring((wstring *)local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string FixText(const NJamSpell::TSpellCorrector& corrector,
                    const std::string& text)
{
    std::wstring input = NJamSpell::UTF8ToWide(text);
    return NJamSpell::WideToUTF8(corrector.FixFragment(input));
}